

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<std::multiset<signed_char,std::less<signed_char>,std::allocator<signed_char>>,void>
               (multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>
                *container,ostream *os)

{
  bool bVar1;
  reference value;
  char *elem;
  iterator __end0;
  iterator __begin0;
  multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> *)0x0;
  __end0 = std::multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>::begin
                     (container);
  elem = (char *)std::multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>::
                 end(container);
  do {
    bVar1 = std::operator==(&__end0,(_Self *)&elem);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_002d0a57:
      if (__range3 !=
          (multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = std::_Rb_tree_const_iterator<signed_char>::operator*(&__end0);
    if ((__range3 !=
         (multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> *)0x0) &&
       (std::operator<<(os,','),
       __range3 ==
       (multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_002d0a57;
    }
    std::operator<<(os,' ');
    UniversalPrint<signed_char>(value,os);
    __range3 = (multiset<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> *)
               &(__range3->_M_t)._M_impl.field_0x1;
    std::_Rb_tree_const_iterator<signed_char>::operator++(&__end0);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }